

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SqlGenerator.cpp
# Opt level: O0

void __thiscall SqlGenerator::generateJoinQuery(SqlGenerator *this)

{
  ulong uVar1;
  element_type *peVar2;
  size_t sVar3;
  char *pcVar4;
  TreeDecomposition *this_00;
  char *in_RDI;
  ofstream ofs;
  size_t var;
  size_t rel;
  string attributeString;
  string joinString;
  size_t in_stack_fffffffffffffc48;
  TreeDecomposition *in_stack_fffffffffffffc50;
  TreeDecomposition *__lhs;
  char *in_stack_fffffffffffffc70;
  TDNode *in_stack_fffffffffffffc78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  string local_358 [32];
  string local_338 [32];
  string local_318 [32];
  string local_2f8 [32];
  string local_2d8 [32];
  string local_2b8 [32];
  ostream local_298 [512];
  string local_98 [32];
  TreeDecomposition *local_78;
  ulong local_70;
  undefined1 local_61 [56];
  allocator local_29;
  string local_28 [40];
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_28,"",&local_29);
  std::allocator<char>::~allocator((allocator<char> *)&local_29);
  __rhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_61;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)(local_61 + 1),"",(allocator *)__rhs);
  std::allocator<char>::~allocator((allocator<char> *)local_61);
  local_70 = 0;
  while( true ) {
    uVar1 = local_70;
    peVar2 = std::__shared_ptr_access<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x30fd97);
    sVar3 = TreeDecomposition::numberOfRelations(peVar2);
    if (sVar3 <= uVar1) break;
    std::__shared_ptr_access<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x30fdc7);
    in_stack_fffffffffffffc78 =
         TreeDecomposition::getRelation(in_stack_fffffffffffffc50,in_stack_fffffffffffffc48);
    std::__cxx11::string::operator+=(local_28,(string *)in_stack_fffffffffffffc78);
    pcVar4 = (char *)(local_70 + 1);
    peVar2 = std::__shared_ptr_access<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x30fe10);
    in_stack_fffffffffffffc70 = (char *)TreeDecomposition::numberOfRelations(peVar2);
    if (pcVar4 < in_stack_fffffffffffffc70) {
      std::__cxx11::string::operator+=(local_28," NATURAL JOIN ");
    }
    local_70 = local_70 + 1;
  }
  local_78 = (TreeDecomposition *)0x0;
  while( true ) {
    __lhs = local_78;
    peVar2 = std::__shared_ptr_access<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x30feed);
    this_00 = (TreeDecomposition *)TreeDecomposition::numberOfAttributes(peVar2);
    if (this_00 <= __lhs) break;
    std::__shared_ptr_access<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x30ff1d);
    in_stack_fffffffffffffc50 =
         (TreeDecomposition *)TreeDecomposition::getAttribute(this_00,(size_t)__lhs);
    std::operator+(&in_stack_fffffffffffffc78->_name,in_stack_fffffffffffffc70);
    std::__cxx11::string::operator+=((string *)(local_61 + 1),local_98);
    std::__cxx11::string::~string(local_98);
    local_78 = (TreeDecomposition *)((_Alloc_hider *)&local_78->_root + 1);
  }
  std::__cxx11::string::pop_back();
  std::operator+(&in_stack_fffffffffffffc78->_name,in_stack_fffffffffffffc70);
  std::ofstream::ofstream(local_298,local_2b8,_S_out);
  std::__cxx11::string::~string(local_2b8);
  std::operator+(in_RDI,__rhs);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__lhs,
                 (char *)in_stack_fffffffffffffc50);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__lhs,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffc50);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__lhs,
                 (char *)in_stack_fffffffffffffc50);
  std::operator<<(local_298,local_2d8);
  std::__cxx11::string::~string(local_2d8);
  std::__cxx11::string::~string(local_2f8);
  std::__cxx11::string::~string(local_318);
  std::__cxx11::string::~string(local_338);
  std::ofstream::close();
  std::operator+(&in_stack_fffffffffffffc78->_name,in_stack_fffffffffffffc70);
  std::ofstream::open((string *)local_298,(_Ios_Openmode)local_358);
  std::__cxx11::string::~string(local_358);
  std::operator<<(local_298,"\\COPY joinres TO \'joinresult.txt\' CSV DELIMITER \'|\';\n");
  std::ofstream::close();
  std::ofstream::~ofstream(local_298);
  std::__cxx11::string::~string((string *)(local_61 + 1));
  std::__cxx11::string::~string(local_28);
  return;
}

Assistant:

void SqlGenerator::generateJoinQuery()
{
    string joinString = "", attributeString  = "";
    
    for (size_t rel = 0; rel < _td->numberOfRelations(); ++rel)
    {    
        joinString += _td->getRelation(rel)->_name;
        if (rel + 1 < _td->numberOfRelations())
            joinString += " NATURAL JOIN ";
    }

    // TODO: This should only output the features not all variables.
    // If changed it should be changed in the Application load test data as well.
    for (size_t var = 0; var < _td->numberOfAttributes(); ++var)
        attributeString += _td->getAttribute(var)->_name + ",";
    attributeString.pop_back();

    std::ofstream ofs(multifaq::dir::OUTPUT_DIRECTORY+"/join.sql", std::ofstream::out);
    ofs << "CREATE TABLE joinres AS (SELECT "+attributeString+
        "\nFROM "+joinString+");\n";
    ofs.close();

    ofs.open(multifaq::dir::OUTPUT_DIRECTORY+"/export.sql", std::ofstream::out);
    ofs << "\\COPY joinres TO \'joinresult.txt\' CSV DELIMITER '|';\n";
    ofs.close();
}